

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

void __thiscall
VectorWriter::
VectorWriter<ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>>>
          (VectorWriter *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchDataIn,
          size_t nPosIn,
          ParamsWrapper<CAddress::SerParams,_std::vector<CAddress,_std::allocator<CAddress>_>_>
          *args)

{
  long in_FS_OFFSET;
  ParamsStream<VectorWriter_&,_CAddress::SerParams> local_30;
  VectorFormatter<DefaultFormatter> local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->vchData = vchDataIn;
  this->nPos = nPosIn;
  if ((ulong)((long)(vchDataIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(vchDataIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) < nPosIn) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(vchDataIn,nPosIn);
  }
  local_30.m_params = args->m_params;
  local_30.m_substream = this;
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<VectorWriter&,CAddress::SerParams>,std::vector<CAddress,std::allocator<CAddress>>>
            (&local_19,&local_30,args->m_object);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VectorWriter(std::vector<unsigned char>& vchDataIn, size_t nPosIn, Args&&... args) : VectorWriter{vchDataIn, nPosIn}
    {
        ::SerializeMany(*this, std::forward<Args>(args)...);
    }